

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

bool testing::internal::
     TypeParameterizedTestSuite<(anonymous_namespace)::UnsignedToString,_testing::internal::Templates<gtest_suite_UnsignedToString_::Ten,_gtest_suite_UnsignedToString_::Max>,_testing::internal::Types<unsigned_char,_unsigned_int,_unsigned_long,_unsigned_long_long>_>
     ::Register(char *prefix,CodeLocation *code_location,TypedTestSuitePState *state,char *case_name
               ,char *test_names,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  byte *pbVar1;
  pointer pcVar2;
  long *plVar3;
  _Alloc_hider _Var4;
  _Alloc_hider _Var5;
  _Alloc_hider _Var6;
  CodeLocation *pCVar7;
  int iVar8;
  char *pcVar9;
  const_iterator cVar10;
  CodeLocation *pCVar11;
  long *plVar12;
  SetUpTearDownSuiteFuncType p_Var13;
  SetUpTearDownSuiteFuncType p_Var14;
  TestFactoryBase *pTVar15;
  char *pcVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  undefined8 extraout_RAX_00;
  long *plVar18;
  size_type *psVar19;
  type_info *ptVar20;
  type_info *ptVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  type_info *ptVar23;
  type_info *ptVar24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  char *pcVar26;
  char *pcVar27;
  ulong uVar28;
  long *local_300;
  long local_2f8;
  long local_2f0;
  long lStack_2e8;
  type_info *local_2e0;
  long local_2d8;
  long local_2d0;
  long lStack_2c8;
  long *local_2c0;
  long local_2b8;
  long local_2b0;
  long lStack_2a8;
  CodeLocation local_2a0;
  string local_278;
  string local_258;
  CodeLocation local_238;
  CodeLocation *local_210;
  string local_208;
  type_info *local_1e8;
  long local_1e0;
  type_info local_1d8;
  undefined7 uStack_1d7;
  long lStack_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a8;
  size_type local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_188;
  size_type local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  TypedTestSuitePState *local_168;
  CodeLocation local_160;
  allocator local_132;
  allocator local_131;
  allocator local_130;
  allocator local_12f;
  allocator local_12e;
  allocator local_12d;
  allocator local_12c;
  allocator local_12b;
  allocator local_12a;
  allocator local_129;
  long *local_128;
  CodeLocation local_120;
  char *local_f8;
  size_type local_f0;
  char local_e8;
  undefined7 uStack_e7;
  undefined8 uStack_e0;
  char *local_d8;
  size_type local_d0;
  char local_c8;
  undefined7 uStack_c7;
  undefined8 uStack_c0;
  string local_b8;
  string test_name_1;
  string test_name;
  internal *local_58 [2];
  long local_48 [2];
  uint local_38;
  
  local_168 = state;
  local_128 = (long *)prefix;
  RegisterTypeParameterizedTestSuiteInstantiation("UnsignedToString");
  pcVar9 = strchr((char *)code_location,0x2c);
  local_210 = code_location;
  if (pcVar9 == (char *)0x0) {
    std::__cxx11::string::string((string *)&local_f8,(char *)code_location,&local_132);
  }
  else {
    local_f8 = &local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,code_location,pcVar9);
  }
  test_name._M_dataplus._M_p = local_f8;
  if (local_f0 != 0) {
    pcVar9 = local_f8 + local_f0;
    do {
      pcVar16 = local_f8;
      iVar8 = isspace((uint)(byte)pcVar9[-1]);
      test_name._M_dataplus._M_p = pcVar16;
      if (iVar8 == 0) break;
      pcVar26 = pcVar9 + -1;
      uVar28 = (long)pcVar26 - (long)pcVar16;
      std::__cxx11::string::_M_erase((ulong)&local_f8,uVar28);
      pcVar9 = local_f8 + uVar28;
      test_name._M_dataplus._M_p = local_f8;
    } while (pcVar26 != pcVar16);
  }
  local_f8 = &local_e8;
  if (test_name._M_dataplus._M_p == local_f8) {
    test_name.field_2._8_8_ = uStack_e0;
    test_name._M_dataplus._M_p = (pointer)&test_name.field_2;
  }
  test_name.field_2._M_allocated_capacity._1_7_ = uStack_e7;
  test_name.field_2._M_local_buf[0] = local_e8;
  test_name._M_string_length = local_f0;
  local_f0 = 0;
  local_e8 = '\0';
  cVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
           ::find(&gtest_typed_test_suite_p_state_UnsignedToString_.registered_tests_._M_t,
                  &test_name);
  iVar8 = 0x246858;
  if ((_Rb_tree_header *)cVar10._M_node ==
      &gtest_typed_test_suite_p_state_UnsignedToString_.registered_tests_._M_t._M_impl.
       super__Rb_tree_header) {
    FormatFileLocation_abi_cxx11_
              (&local_2a0.file,(internal *)*local_128,(char *)(ulong)*(uint *)(local_128 + 4),
               0x246858);
    TypeParameterizedTestSuite<(anonymous_namespace)::UnsignedToString,testing::internal::Templates<gtest_suite_UnsignedToString_::Ten,gtest_suite_UnsignedToString_::Max>,testing::internal::Types<unsigned_char,unsigned_int,unsigned_long,unsigned_long_long>>
    ::Register();
  }
  else {
    pCVar11 = TypedTestSuitePState::GetCodeLocation
                        (&gtest_typed_test_suite_p_state_UnsignedToString_,&test_name);
    local_2c0 = &local_2b0;
    local_2b0 = CONCAT44(local_2b0._4_4_,0x533255);
    local_2b8 = 3;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_2c0);
    local_300 = &local_2f0;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_2f0 = *plVar18;
      lStack_2e8 = plVar12[3];
    }
    else {
      local_2f0 = *plVar18;
      local_300 = (long *)*plVar12;
    }
    local_2f8 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_300);
    local_160.file._M_dataplus._M_p = (pointer)&local_160.file.field_2;
    psVar19 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar19) {
      local_160.file.field_2._M_allocated_capacity = *psVar19;
      local_160.file.field_2._8_8_ = plVar12[3];
    }
    else {
      local_160.file.field_2._M_allocated_capacity = *psVar19;
      local_160.file._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_160.file._M_string_length = plVar12[1];
    *plVar12 = (long)psVar19;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_160);
    local_238.file._M_dataplus._M_p = (pointer)&local_238.file.field_2;
    psVar19 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar19) {
      local_238.file.field_2._M_allocated_capacity = *psVar19;
      local_238.file.field_2._8_8_ = plVar12[3];
    }
    else {
      local_238.file.field_2._M_allocated_capacity = *psVar19;
      local_238.file._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_238.file._M_string_length = plVar12[1];
    *plVar12 = (long)psVar19;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::_M_append((char *)&local_238,**(ulong **)local_168);
    pCVar7 = local_210;
    local_2a0.file._M_dataplus._M_p = (pointer)&local_2a0.file.field_2;
    psVar19 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar19) {
      local_2a0.file.field_2._M_allocated_capacity = *psVar19;
      local_2a0.file.field_2._8_8_ = plVar12[3];
    }
    else {
      local_2a0.file.field_2._M_allocated_capacity = *psVar19;
      local_2a0.file._M_dataplus._M_p = (pointer)*plVar12;
    }
    _Var4._M_p = local_2a0.file._M_dataplus._M_p;
    local_2a0.file._M_string_length = plVar12[1];
    *plVar12 = (long)psVar19;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    pcVar9 = strchr((char *)local_210,0x2c);
    if (pcVar9 == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_1e8,(char *)pCVar7,&local_131);
    }
    else {
      local_1e8 = &local_1d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,pCVar7,pcVar9);
    }
    local_2e0 = local_1e8;
    if (local_1e0 != 0) {
      ptVar20 = local_1e8 + local_1e0;
      do {
        ptVar23 = local_1e8;
        iVar8 = isspace((uint)(byte)ptVar20[-1]);
        local_2e0 = ptVar23;
        if (iVar8 == 0) break;
        ptVar21 = ptVar20 + -1;
        uVar28 = (long)ptVar21 - (long)ptVar23;
        std::__cxx11::string::_M_erase((ulong)&local_1e8,uVar28);
        ptVar20 = local_1e8 + uVar28;
        local_2e0 = local_1e8;
      } while (ptVar21 != ptVar23);
    }
    local_1e8 = &local_1d8;
    if (local_2e0 == local_1e8) {
      lStack_2c8 = lStack_1d0;
      local_2e0 = (type_info *)&local_2d0;
    }
    ptVar20 = local_2e0;
    local_2d0 = CONCAT71(uStack_1d7,local_1d8);
    local_2d8 = local_1e0;
    local_1e0 = 0;
    local_1d8 = (type_info)0x0;
    GetTypeName_abi_cxx11_(&local_278,(internal *)&unsigned_char::typeinfo,local_1e8);
    _Var5._M_p = local_278._M_dataplus._M_p;
    local_120.file._M_dataplus._M_p = (pointer)&local_120.file.field_2;
    pcVar2 = (pCVar11->file)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_120,pcVar2,pcVar2 + (pCVar11->file)._M_string_length);
    local_120.line = pCVar11->line;
    p_Var13 = SuiteApiResolver<gtest_suite_UnsignedToString_::Ten<unsigned_char>_>::
              GetSetUpCaseOrSuite((pCVar11->file)._M_dataplus._M_p,local_120.line);
    p_Var14 = SuiteApiResolver<gtest_suite_UnsignedToString_::Ten<unsigned_char>_>::
              GetTearDownCaseOrSuite((pCVar11->file)._M_dataplus._M_p,pCVar11->line);
    pTVar15 = (TestFactoryBase *)operator_new(8);
    pTVar15->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0023ee10;
    MakeAndRegisterTestInfo
              (_Var4._M_p,(char *)ptVar20,_Var5._M_p,(char *)0x0,&local_120,
               &TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_char>>::dummy_,p_Var13
               ,p_Var14,pTVar15);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120.file._M_dataplus._M_p != &local_120.file.field_2) {
      operator_delete(local_120.file._M_dataplus._M_p,
                      local_120.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if (local_2e0 != (type_info *)&local_2d0) {
      operator_delete(local_2e0,local_2d0 + 1);
    }
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,CONCAT71(uStack_1d7,local_1d8) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0.file._M_dataplus._M_p != &local_2a0.file.field_2) {
      operator_delete(local_2a0.file._M_dataplus._M_p,
                      local_2a0.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.file._M_dataplus._M_p != &local_238.file.field_2) {
      operator_delete(local_238.file._M_dataplus._M_p,
                      local_238.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160.file._M_dataplus._M_p != &local_160.file.field_2) {
      operator_delete(local_160.file._M_dataplus._M_p,
                      local_160.file.field_2._M_allocated_capacity + 1);
    }
    if (local_300 != &local_2f0) {
      operator_delete(local_300,local_2f0 + 1);
    }
    if (local_2c0 != &local_2b0) {
      operator_delete(local_2c0,local_2b0 + 1);
    }
    local_2e0 = (type_info *)&local_2d0;
    local_2d0 = CONCAT44(local_2d0._4_4_,0x533255);
    local_2d8 = 3;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_2e0);
    local_2c0 = &local_2b0;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_2b0 = *plVar18;
      lStack_2a8 = plVar12[3];
    }
    else {
      local_2b0 = *plVar18;
      local_2c0 = (long *)*plVar12;
    }
    local_2b8 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_2c0);
    local_300 = &local_2f0;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_2f0 = *plVar18;
      lStack_2e8 = plVar12[3];
    }
    else {
      local_2f0 = *plVar18;
      local_300 = (long *)*plVar12;
    }
    local_2f8 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_300);
    local_238.file._M_dataplus._M_p = (pointer)&local_238.file.field_2;
    psVar19 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar19) {
      local_238.file.field_2._M_allocated_capacity = *psVar19;
      local_238.file.field_2._8_8_ = plVar12[3];
    }
    else {
      local_238.file.field_2._M_allocated_capacity = *psVar19;
      local_238.file._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_238.file._M_string_length = plVar12[1];
    *plVar12 = (long)psVar19;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_238,*(ulong *)(*(long *)local_168 + 0x20));
    pCVar7 = local_210;
    local_2a0.file._M_dataplus._M_p = (pointer)&local_2a0.file.field_2;
    psVar19 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar19) {
      local_2a0.file.field_2._M_allocated_capacity = *psVar19;
      local_2a0.file.field_2._8_8_ = plVar12[3];
    }
    else {
      local_2a0.file.field_2._M_allocated_capacity = *psVar19;
      local_2a0.file._M_dataplus._M_p = (pointer)*plVar12;
    }
    _Var4._M_p = local_2a0.file._M_dataplus._M_p;
    local_2a0.file._M_string_length = plVar12[1];
    *plVar12 = (long)psVar19;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    pcVar9 = strchr((char *)local_210,0x2c);
    if (pcVar9 == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_1c8,(char *)pCVar7,&local_130);
    }
    else {
      local_1c8 = &local_1b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,pCVar7,pcVar9);
    }
    local_278._M_dataplus._M_p = (pointer)local_1c8;
    if (local_1c0 != 0) {
      ptVar20 = (type_info *)(local_1c8->_M_local_buf + local_1c0);
      do {
        paVar17 = local_1c8;
        iVar8 = isspace((uint)(byte)ptVar20[-1]);
        local_278._M_dataplus._M_p = (pointer)paVar17;
        if (iVar8 == 0) break;
        paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(ptVar20 + -1);
        uVar28 = (long)paVar22 - (long)paVar17;
        std::__cxx11::string::_M_erase((ulong)&local_1c8,uVar28);
        ptVar20 = (type_info *)(local_1c8->_M_local_buf + uVar28);
        local_278._M_dataplus._M_p = (pointer)local_1c8;
      } while (paVar22 != paVar17);
    }
    local_1c8 = &local_1b8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p == local_1c8) {
      local_278.field_2._8_8_ = local_1b8._8_8_;
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    }
    _Var5._M_p = local_278._M_dataplus._M_p;
    local_278.field_2._M_allocated_capacity._1_7_ = local_1b8._M_allocated_capacity._1_7_;
    local_278.field_2._M_local_buf[0] = local_1b8._M_local_buf[0];
    local_278._M_string_length = local_1c0;
    local_1c0 = 0;
    local_1b8._M_local_buf[0] = '\0';
    GetTypeName_abi_cxx11_
              (&local_258,(internal *)&unsigned_int::typeinfo,(type_info *)local_1c8->_M_local_buf);
    _Var6._M_p = local_258._M_dataplus._M_p;
    local_160.file._M_dataplus._M_p = (pointer)&local_160.file.field_2;
    pcVar2 = (pCVar11->file)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_160,pcVar2,pcVar2 + (pCVar11->file)._M_string_length);
    local_160.line = pCVar11->line;
    p_Var13 = SuiteApiResolver<gtest_suite_UnsignedToString_::Ten<unsigned_int>_>::
              GetSetUpCaseOrSuite((pCVar11->file)._M_dataplus._M_p,local_160.line);
    p_Var14 = SuiteApiResolver<gtest_suite_UnsignedToString_::Ten<unsigned_int>_>::
              GetTearDownCaseOrSuite((pCVar11->file)._M_dataplus._M_p,pCVar11->line);
    pTVar15 = (TestFactoryBase *)operator_new(8);
    pTVar15->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0023eea8;
    MakeAndRegisterTestInfo
              (_Var4._M_p,_Var5._M_p,_Var6._M_p,(char *)0x0,&local_160,
               &TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_int>>::dummy_,p_Var13,
               p_Var14,pTVar15);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160.file._M_dataplus._M_p != &local_160.file.field_2) {
      operator_delete(local_160.file._M_dataplus._M_p,
                      local_160.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,
                      CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0.file._M_dataplus._M_p != &local_2a0.file.field_2) {
      operator_delete(local_2a0.file._M_dataplus._M_p,
                      local_2a0.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.file._M_dataplus._M_p != &local_238.file.field_2) {
      operator_delete(local_238.file._M_dataplus._M_p,
                      local_238.file.field_2._M_allocated_capacity + 1);
    }
    if (local_300 != &local_2f0) {
      operator_delete(local_300,local_2f0 + 1);
    }
    if (local_2c0 != &local_2b0) {
      operator_delete(local_2c0,local_2b0 + 1);
    }
    if (local_2e0 != (type_info *)&local_2d0) {
      operator_delete(local_2e0,local_2d0 + 1);
    }
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    local_278.field_2._M_allocated_capacity._0_4_ = 0x533255;
    local_278._M_string_length = 3;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_278);
    local_2e0 = (type_info *)&local_2d0;
    ptVar20 = (type_info *)(plVar12 + 2);
    if ((type_info *)*plVar12 == ptVar20) {
      local_2d0 = *(long *)ptVar20;
      lStack_2c8 = plVar12[3];
    }
    else {
      local_2d0 = *(long *)ptVar20;
      local_2e0 = (type_info *)*plVar12;
    }
    local_2d8 = plVar12[1];
    *plVar12 = (long)ptVar20;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_2e0);
    local_2c0 = &local_2b0;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_2b0 = *plVar18;
      lStack_2a8 = plVar12[3];
    }
    else {
      local_2b0 = *plVar18;
      local_2c0 = (long *)*plVar12;
    }
    local_2b8 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_2c0);
    local_300 = &local_2f0;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_2f0 = *plVar18;
      lStack_2e8 = plVar12[3];
    }
    else {
      local_2f0 = *plVar18;
      local_300 = (long *)*plVar12;
    }
    local_2f8 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_300,*(ulong *)(*(long *)local_168 + 0x40));
    pCVar7 = local_210;
    local_2a0.file._M_dataplus._M_p = (pointer)&local_2a0.file.field_2;
    psVar19 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar19) {
      local_2a0.file.field_2._M_allocated_capacity = *psVar19;
      local_2a0.file.field_2._8_8_ = plVar12[3];
    }
    else {
      local_2a0.file.field_2._M_allocated_capacity = *psVar19;
      local_2a0.file._M_dataplus._M_p = (pointer)*plVar12;
    }
    _Var4._M_p = local_2a0.file._M_dataplus._M_p;
    local_2a0.file._M_string_length = plVar12[1];
    *plVar12 = (long)psVar19;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    pcVar9 = strchr((char *)local_210,0x2c);
    if (pcVar9 == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_1a8,(char *)pCVar7,&local_12f);
    }
    else {
      local_1a8 = &local_198;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,pCVar7,pcVar9);
    }
    local_258._M_dataplus._M_p = (pointer)local_1a8;
    if (local_1a0 != 0) {
      ptVar20 = (type_info *)(local_1a8->_M_local_buf + local_1a0);
      do {
        paVar17 = local_1a8;
        iVar8 = isspace((uint)(byte)ptVar20[-1]);
        local_258._M_dataplus._M_p = (pointer)paVar17;
        if (iVar8 == 0) break;
        paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(ptVar20 + -1);
        uVar28 = (long)paVar22 - (long)paVar17;
        std::__cxx11::string::_M_erase((ulong)&local_1a8,uVar28);
        ptVar20 = (type_info *)(local_1a8->_M_local_buf + uVar28);
        local_258._M_dataplus._M_p = (pointer)local_1a8;
      } while (paVar22 != paVar17);
    }
    local_1a8 = &local_198;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p == local_1a8) {
      local_258.field_2._8_8_ = local_198._8_8_;
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    }
    _Var5._M_p = local_258._M_dataplus._M_p;
    local_258.field_2._M_allocated_capacity._1_7_ = local_198._M_allocated_capacity._1_7_;
    local_258.field_2._M_local_buf[0] = local_198._M_local_buf[0];
    local_258._M_string_length = local_1a0;
    local_1a0 = 0;
    local_198._M_local_buf[0] = '\0';
    GetTypeName_abi_cxx11_
              (&local_208,(internal *)&unsigned_long::typeinfo,(type_info *)local_1a8->_M_local_buf)
    ;
    _Var6._M_p = local_208._M_dataplus._M_p;
    local_238.file._M_dataplus._M_p = (pointer)&local_238.file.field_2;
    pcVar2 = (pCVar11->file)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_238,pcVar2,pcVar2 + (pCVar11->file)._M_string_length);
    local_238.line = pCVar11->line;
    p_Var13 = SuiteApiResolver<gtest_suite_UnsignedToString_::Ten<unsigned_long>_>::
              GetSetUpCaseOrSuite((pCVar11->file)._M_dataplus._M_p,local_238.line);
    p_Var14 = SuiteApiResolver<gtest_suite_UnsignedToString_::Ten<unsigned_long>_>::
              GetTearDownCaseOrSuite((pCVar11->file)._M_dataplus._M_p,pCVar11->line);
    pTVar15 = (TestFactoryBase *)operator_new(8);
    pTVar15->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0023ef40;
    MakeAndRegisterTestInfo
              (_Var4._M_p,_Var5._M_p,_Var6._M_p,(char *)0x0,&local_238,
               &TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_long>>::dummy_,p_Var13
               ,p_Var14,pTVar15);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.file._M_dataplus._M_p != &local_238.file.field_2) {
      operator_delete(local_238.file._M_dataplus._M_p,
                      local_238.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,
                      CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0.file._M_dataplus._M_p != &local_2a0.file.field_2) {
      operator_delete(local_2a0.file._M_dataplus._M_p,
                      local_2a0.file.field_2._M_allocated_capacity + 1);
    }
    if (local_300 != &local_2f0) {
      operator_delete(local_300,local_2f0 + 1);
    }
    if (local_2c0 != &local_2b0) {
      operator_delete(local_2c0,local_2b0 + 1);
    }
    if (local_2e0 != (type_info *)&local_2d0) {
      operator_delete(local_2e0,local_2d0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    local_258.field_2._M_allocated_capacity._0_4_ = 0x533255;
    local_258._M_string_length = 3;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_258);
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 == paVar17) {
      local_278.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_278.field_2._8_8_ = plVar12[3];
    }
    else {
      local_278.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_278._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_278._M_string_length = plVar12[1];
    *plVar12 = (long)paVar17;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_278);
    local_2e0 = (type_info *)&local_2d0;
    ptVar20 = (type_info *)(plVar12 + 2);
    if ((type_info *)*plVar12 == ptVar20) {
      local_2d0 = *(long *)ptVar20;
      lStack_2c8 = plVar12[3];
    }
    else {
      local_2d0 = *(long *)ptVar20;
      local_2e0 = (type_info *)*plVar12;
    }
    local_2d8 = plVar12[1];
    *plVar12 = (long)ptVar20;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_2e0);
    local_2c0 = &local_2b0;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_2b0 = *plVar18;
      lStack_2a8 = plVar12[3];
    }
    else {
      local_2b0 = *plVar18;
      local_2c0 = (long *)*plVar12;
    }
    local_2b8 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_2c0,*(ulong *)(*(long *)local_168 + 0x60));
    pCVar7 = local_210;
    local_300 = &local_2f0;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_2f0 = *plVar18;
      lStack_2e8 = plVar12[3];
    }
    else {
      local_2f0 = *plVar18;
      local_300 = (long *)*plVar12;
    }
    plVar3 = local_300;
    local_2f8 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    pcVar9 = strchr((char *)local_210,0x2c);
    if (pcVar9 == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_188,(char *)pCVar7,&local_12e);
    }
    else {
      local_188 = &local_178;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,pCVar7,pcVar9);
    }
    local_208._M_dataplus._M_p = (pointer)local_188;
    if (local_180 != 0) {
      ptVar20 = (type_info *)(local_188->_M_local_buf + local_180);
      do {
        paVar17 = local_188;
        iVar8 = isspace((uint)(byte)ptVar20[-1]);
        local_208._M_dataplus._M_p = (pointer)paVar17;
        if (iVar8 == 0) break;
        paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(ptVar20 + -1);
        uVar28 = (long)paVar22 - (long)paVar17;
        std::__cxx11::string::_M_erase((ulong)&local_188,uVar28);
        ptVar20 = (type_info *)(local_188->_M_local_buf + uVar28);
        local_208._M_dataplus._M_p = (pointer)local_188;
      } while (paVar22 != paVar17);
    }
    local_188 = &local_178;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p == local_188) {
      local_208.field_2._8_8_ = local_178._8_8_;
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    }
    _Var4._M_p = local_208._M_dataplus._M_p;
    local_208.field_2._M_allocated_capacity._1_7_ = local_178._M_allocated_capacity._1_7_;
    local_208.field_2._M_local_buf[0] = local_178._M_local_buf[0];
    local_208._M_string_length = local_180;
    local_180 = 0;
    local_178._M_local_buf[0] = '\0';
    GetTypeName_abi_cxx11_
              (&local_b8,(internal *)&unsigned_long_long::typeinfo,
               (type_info *)local_188->_M_local_buf);
    _Var5._M_p = local_b8._M_dataplus._M_p;
    local_2a0.file._M_dataplus._M_p = (pointer)&local_2a0.file.field_2;
    pcVar2 = (pCVar11->file)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,pcVar2,pcVar2 + (pCVar11->file)._M_string_length);
    local_2a0.line = pCVar11->line;
    p_Var13 = SuiteApiResolver<gtest_suite_UnsignedToString_::Ten<unsigned_long_long>_>::
              GetSetUpCaseOrSuite((pCVar11->file)._M_dataplus._M_p,local_2a0.line);
    p_Var14 = SuiteApiResolver<gtest_suite_UnsignedToString_::Ten<unsigned_long_long>_>::
              GetTearDownCaseOrSuite((pCVar11->file)._M_dataplus._M_p,pCVar11->line);
    pTVar15 = (TestFactoryBase *)operator_new(8);
    pTVar15->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0023efd8;
    MakeAndRegisterTestInfo
              ((char *)plVar3,_Var4._M_p,_Var5._M_p,(char *)0x0,&local_2a0,
               &TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_long_long>>::dummy_,
               p_Var13,p_Var14,pTVar15);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0.file._M_dataplus._M_p != &local_2a0.file.field_2) {
      operator_delete(local_2a0.file._M_dataplus._M_p,
                      local_2a0.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if (local_188 != &local_178) {
      operator_delete(local_188,
                      CONCAT71(local_178._M_allocated_capacity._1_7_,local_178._M_local_buf[0]) + 1)
      ;
    }
    if (local_300 != &local_2f0) {
      operator_delete(local_300,local_2f0 + 1);
    }
    if (local_2c0 != &local_2b0) {
      operator_delete(local_2c0,local_2b0 + 1);
    }
    if (local_2e0 != (type_info *)&local_2d0) {
      operator_delete(local_2e0,local_2d0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    local_58[0] = (internal *)local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,*local_128,local_128[1] + *local_128);
    local_38 = *(uint *)(local_128 + 4);
    pcVar9 = strchr((char *)local_210,0x2c);
    if (pcVar9 == (char *)0x0) {
      pcVar9 = (char *)0x0;
    }
    else {
      do {
        pbVar1 = (byte *)(pcVar9 + 1);
        pcVar9 = pcVar9 + 1;
        iVar8 = isspace((uint)*pbVar1);
      } while (iVar8 != 0);
    }
    RegisterTypeParameterizedTestSuiteInstantiation("UnsignedToString");
    pcVar16 = strchr(pcVar9,0x2c);
    if (pcVar16 == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_d8,pcVar9,&local_12d);
    }
    else {
      local_d8 = &local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,pcVar9,pcVar16);
    }
    test_name_1._M_dataplus._M_p = local_d8;
    if (local_d0 != 0) {
      pcVar16 = local_d8 + local_d0;
      do {
        pcVar26 = local_d8;
        iVar8 = isspace((uint)(byte)pcVar16[-1]);
        test_name_1._M_dataplus._M_p = pcVar26;
        if (iVar8 == 0) break;
        pcVar27 = pcVar16 + -1;
        uVar28 = (long)pcVar27 - (long)pcVar26;
        std::__cxx11::string::_M_erase((ulong)&local_d8,uVar28);
        pcVar16 = local_d8 + uVar28;
        test_name_1._M_dataplus._M_p = local_d8;
      } while (pcVar27 != pcVar26);
    }
    local_d8 = &local_c8;
    if (test_name_1._M_dataplus._M_p == local_d8) {
      test_name_1.field_2._8_8_ = uStack_c0;
      test_name_1._M_dataplus._M_p = (pointer)&test_name_1.field_2;
    }
    test_name_1.field_2._M_allocated_capacity._1_7_ = uStack_c7;
    test_name_1.field_2._M_local_buf[0] = local_c8;
    test_name_1._M_string_length = local_d0;
    local_d0 = 0;
    local_c8 = '\0';
    cVar10 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
             ::find(&gtest_typed_test_suite_p_state_UnsignedToString_.registered_tests_._M_t,
                    &test_name_1);
    iVar8 = 0x246858;
    if ((_Rb_tree_header *)cVar10._M_node !=
        &gtest_typed_test_suite_p_state_UnsignedToString_.registered_tests_._M_t._M_impl.
         super__Rb_tree_header) {
      pCVar11 = TypedTestSuitePState::GetCodeLocation
                          (&gtest_typed_test_suite_p_state_UnsignedToString_,&test_name_1);
      local_2c0 = &local_2b0;
      local_2b0 = CONCAT44(local_2b0._4_4_,0x533255);
      local_2b8 = 3;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_2c0);
      local_300 = &local_2f0;
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_2f0 = *plVar18;
        lStack_2e8 = plVar12[3];
      }
      else {
        local_2f0 = *plVar18;
        local_300 = (long *)*plVar12;
      }
      local_2f8 = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_300);
      local_160.file._M_dataplus._M_p = (pointer)&local_160.file.field_2;
      psVar19 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar19) {
        local_160.file.field_2._M_allocated_capacity = *psVar19;
        local_160.file.field_2._8_8_ = plVar12[3];
      }
      else {
        local_160.file.field_2._M_allocated_capacity = *psVar19;
        local_160.file._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_160.file._M_string_length = plVar12[1];
      *plVar12 = (long)psVar19;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_160);
      local_238.file._M_dataplus._M_p = (pointer)&local_238.file.field_2;
      psVar19 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar19) {
        local_238.file.field_2._M_allocated_capacity = *psVar19;
        local_238.file.field_2._8_8_ = plVar12[3];
      }
      else {
        local_238.file.field_2._M_allocated_capacity = *psVar19;
        local_238.file._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_238.file._M_string_length = plVar12[1];
      *plVar12 = (long)psVar19;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::_M_append((char *)&local_238,**(ulong **)local_168);
      local_2a0.file._M_dataplus._M_p = (pointer)&local_2a0.file.field_2;
      psVar19 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar19) {
        local_2a0.file.field_2._M_allocated_capacity = *psVar19;
        local_2a0.file.field_2._8_8_ = plVar12[3];
      }
      else {
        local_2a0.file.field_2._M_allocated_capacity = *psVar19;
        local_2a0.file._M_dataplus._M_p = (pointer)*plVar12;
      }
      _Var4._M_p = local_2a0.file._M_dataplus._M_p;
      local_2a0.file._M_string_length = plVar12[1];
      *plVar12 = (long)psVar19;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      pcVar16 = strchr(pcVar9,0x2c);
      if (pcVar16 == (char *)0x0) {
        std::__cxx11::string::string((string *)&local_1e8,pcVar9,&local_12c);
      }
      else {
        local_1e8 = &local_1d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,pcVar9,pcVar16);
      }
      local_210 = (CodeLocation *)_Var4._M_p;
      ptVar20 = local_1e8;
      if (local_1e0 != 0) {
        ptVar23 = local_1e8 + local_1e0;
        do {
          ptVar21 = local_1e8;
          iVar8 = isspace((uint)(byte)ptVar23[-1]);
          ptVar20 = ptVar21;
          if (iVar8 == 0) break;
          ptVar24 = ptVar23 + -1;
          uVar28 = (long)ptVar24 - (long)ptVar21;
          std::__cxx11::string::_M_erase((ulong)&local_1e8,uVar28);
          ptVar23 = local_1e8 + uVar28;
          ptVar20 = local_1e8;
        } while (ptVar24 != ptVar21);
      }
      local_1e8 = &local_1d8;
      local_2e0 = ptVar20;
      if (ptVar20 == local_1e8) {
        lStack_2c8 = lStack_1d0;
        local_2e0 = (type_info *)&local_2d0;
      }
      ptVar20 = local_2e0;
      local_2d0 = CONCAT71(uStack_1d7,local_1d8);
      local_2d8 = local_1e0;
      local_1e0 = 0;
      local_1d8 = (type_info)0x0;
      GetTypeName_abi_cxx11_(&local_278,(internal *)&unsigned_char::typeinfo,local_1e8);
      _Var4._M_p = local_278._M_dataplus._M_p;
      local_120.file._M_dataplus._M_p = (pointer)&local_120.file.field_2;
      pcVar2 = (pCVar11->file)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_120,pcVar2,pcVar2 + (pCVar11->file)._M_string_length);
      local_120.line = pCVar11->line;
      p_Var13 = SuiteApiResolver<gtest_suite_UnsignedToString_::Max<unsigned_char>_>::
                GetSetUpCaseOrSuite((pCVar11->file)._M_dataplus._M_p,local_120.line);
      p_Var14 = SuiteApiResolver<gtest_suite_UnsignedToString_::Max<unsigned_char>_>::
                GetTearDownCaseOrSuite((pCVar11->file)._M_dataplus._M_p,pCVar11->line);
      pTVar15 = (TestFactoryBase *)operator_new(8);
      pTVar15->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0023f070;
      MakeAndRegisterTestInfo
                ((char *)local_210,(char *)ptVar20,_Var4._M_p,(char *)0x0,&local_120,
                 &TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_char>>::dummy_,
                 p_Var13,p_Var14,pTVar15);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120.file._M_dataplus._M_p != &local_120.file.field_2) {
        operator_delete(local_120.file._M_dataplus._M_p,
                        local_120.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if (local_2e0 != (type_info *)&local_2d0) {
        operator_delete(local_2e0,local_2d0 + 1);
      }
      if (local_1e8 != &local_1d8) {
        operator_delete(local_1e8,CONCAT71(uStack_1d7,local_1d8) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0.file._M_dataplus._M_p != &local_2a0.file.field_2) {
        operator_delete(local_2a0.file._M_dataplus._M_p,
                        local_2a0.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238.file._M_dataplus._M_p != &local_238.file.field_2) {
        operator_delete(local_238.file._M_dataplus._M_p,
                        local_238.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160.file._M_dataplus._M_p != &local_160.file.field_2) {
        operator_delete(local_160.file._M_dataplus._M_p,
                        local_160.file.field_2._M_allocated_capacity + 1);
      }
      if (local_300 != &local_2f0) {
        operator_delete(local_300,local_2f0 + 1);
      }
      if (local_2c0 != &local_2b0) {
        operator_delete(local_2c0,local_2b0 + 1);
      }
      local_2e0 = (type_info *)&local_2d0;
      local_2d0 = CONCAT44(local_2d0._4_4_,0x533255);
      local_2d8 = 3;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_2e0);
      local_2c0 = &local_2b0;
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_2b0 = *plVar18;
        lStack_2a8 = plVar12[3];
      }
      else {
        local_2b0 = *plVar18;
        local_2c0 = (long *)*plVar12;
      }
      local_2b8 = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_2c0);
      local_300 = &local_2f0;
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_2f0 = *plVar18;
        lStack_2e8 = plVar12[3];
      }
      else {
        local_2f0 = *plVar18;
        local_300 = (long *)*plVar12;
      }
      local_2f8 = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_300);
      local_238.file._M_dataplus._M_p = (pointer)&local_238.file.field_2;
      psVar19 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar19) {
        local_238.file.field_2._M_allocated_capacity = *psVar19;
        local_238.file.field_2._8_8_ = plVar12[3];
      }
      else {
        local_238.file.field_2._M_allocated_capacity = *psVar19;
        local_238.file._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_238.file._M_string_length = plVar12[1];
      *plVar12 = (long)psVar19;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_238,*(ulong *)(*(long *)local_168 + 0x20));
      local_2a0.file._M_dataplus._M_p = (pointer)&local_2a0.file.field_2;
      psVar19 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar19) {
        local_2a0.file.field_2._M_allocated_capacity = *psVar19;
        local_2a0.file.field_2._8_8_ = plVar12[3];
      }
      else {
        local_2a0.file.field_2._M_allocated_capacity = *psVar19;
        local_2a0.file._M_dataplus._M_p = (pointer)*plVar12;
      }
      _Var4._M_p = local_2a0.file._M_dataplus._M_p;
      local_2a0.file._M_string_length = plVar12[1];
      *plVar12 = (long)psVar19;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      pcVar16 = strchr(pcVar9,0x2c);
      if (pcVar16 == (char *)0x0) {
        std::__cxx11::string::string((string *)&local_1c8,pcVar9,&local_12b);
      }
      else {
        local_1c8 = &local_1b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,pcVar9,pcVar16);
      }
      local_210 = (CodeLocation *)_Var4._M_p;
      paVar17 = local_1c8;
      if (local_1c0 != 0) {
        ptVar20 = (type_info *)(local_1c8->_M_local_buf + local_1c0);
        do {
          paVar22 = local_1c8;
          iVar8 = isspace((uint)(byte)ptVar20[-1]);
          paVar17 = paVar22;
          if (iVar8 == 0) break;
          paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(ptVar20 + -1);
          uVar28 = (long)paVar25 - (long)paVar22;
          std::__cxx11::string::_M_erase((ulong)&local_1c8,uVar28);
          ptVar20 = (type_info *)(local_1c8->_M_local_buf + uVar28);
          paVar17 = local_1c8;
        } while (paVar25 != paVar22);
      }
      local_1c8 = &local_1b8;
      local_278._M_dataplus._M_p = (pointer)paVar17;
      if (paVar17 == local_1c8) {
        local_278.field_2._8_8_ = local_1b8._8_8_;
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      }
      _Var4._M_p = local_278._M_dataplus._M_p;
      local_278.field_2._M_allocated_capacity._1_7_ = local_1b8._M_allocated_capacity._1_7_;
      local_278.field_2._M_local_buf[0] = local_1b8._M_local_buf[0];
      local_278._M_string_length = local_1c0;
      local_1c0 = 0;
      local_1b8._M_local_buf[0] = '\0';
      GetTypeName_abi_cxx11_
                (&local_258,(internal *)&unsigned_int::typeinfo,(type_info *)local_1c8->_M_local_buf
                );
      _Var5._M_p = local_258._M_dataplus._M_p;
      local_160.file._M_dataplus._M_p = (pointer)&local_160.file.field_2;
      pcVar2 = (pCVar11->file)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_160,pcVar2,pcVar2 + (pCVar11->file)._M_string_length);
      local_160.line = pCVar11->line;
      p_Var13 = SuiteApiResolver<gtest_suite_UnsignedToString_::Max<unsigned_int>_>::
                GetSetUpCaseOrSuite((pCVar11->file)._M_dataplus._M_p,local_160.line);
      p_Var14 = SuiteApiResolver<gtest_suite_UnsignedToString_::Max<unsigned_int>_>::
                GetTearDownCaseOrSuite((pCVar11->file)._M_dataplus._M_p,pCVar11->line);
      pTVar15 = (TestFactoryBase *)operator_new(8);
      pTVar15->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0023f108;
      MakeAndRegisterTestInfo
                ((char *)local_210,_Var4._M_p,_Var5._M_p,(char *)0x0,&local_160,
                 &TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_int>>::dummy_,
                 p_Var13,p_Var14,pTVar15);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160.file._M_dataplus._M_p != &local_160.file.field_2) {
        operator_delete(local_160.file._M_dataplus._M_p,
                        local_160.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if (local_1c8 != &local_1b8) {
        operator_delete(local_1c8,
                        CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0.file._M_dataplus._M_p != &local_2a0.file.field_2) {
        operator_delete(local_2a0.file._M_dataplus._M_p,
                        local_2a0.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238.file._M_dataplus._M_p != &local_238.file.field_2) {
        operator_delete(local_238.file._M_dataplus._M_p,
                        local_238.file.field_2._M_allocated_capacity + 1);
      }
      if (local_300 != &local_2f0) {
        operator_delete(local_300,local_2f0 + 1);
      }
      if (local_2c0 != &local_2b0) {
        operator_delete(local_2c0,local_2b0 + 1);
      }
      if (local_2e0 != (type_info *)&local_2d0) {
        operator_delete(local_2e0,local_2d0 + 1);
      }
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      local_278.field_2._M_allocated_capacity._0_4_ = 0x533255;
      local_278._M_string_length = 3;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_278);
      local_2e0 = (type_info *)&local_2d0;
      ptVar20 = (type_info *)(plVar12 + 2);
      if ((type_info *)*plVar12 == ptVar20) {
        local_2d0 = *(long *)ptVar20;
        lStack_2c8 = plVar12[3];
      }
      else {
        local_2d0 = *(long *)ptVar20;
        local_2e0 = (type_info *)*plVar12;
      }
      local_2d8 = plVar12[1];
      *plVar12 = (long)ptVar20;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_2e0);
      local_2c0 = &local_2b0;
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_2b0 = *plVar18;
        lStack_2a8 = plVar12[3];
      }
      else {
        local_2b0 = *plVar18;
        local_2c0 = (long *)*plVar12;
      }
      local_2b8 = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_2c0);
      local_300 = &local_2f0;
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_2f0 = *plVar18;
        lStack_2e8 = plVar12[3];
      }
      else {
        local_2f0 = *plVar18;
        local_300 = (long *)*plVar12;
      }
      local_2f8 = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_300,*(ulong *)(*(long *)local_168 + 0x40));
      local_2a0.file._M_dataplus._M_p = (pointer)&local_2a0.file.field_2;
      psVar19 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar19) {
        local_2a0.file.field_2._M_allocated_capacity = *psVar19;
        local_2a0.file.field_2._8_8_ = plVar12[3];
      }
      else {
        local_2a0.file.field_2._M_allocated_capacity = *psVar19;
        local_2a0.file._M_dataplus._M_p = (pointer)*plVar12;
      }
      _Var4._M_p = local_2a0.file._M_dataplus._M_p;
      local_2a0.file._M_string_length = plVar12[1];
      *plVar12 = (long)psVar19;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      pcVar16 = strchr(pcVar9,0x2c);
      if (pcVar16 == (char *)0x0) {
        std::__cxx11::string::string((string *)&local_1a8,pcVar9,&local_12a);
      }
      else {
        local_1a8 = &local_198;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,pcVar9,pcVar16);
      }
      local_210 = (CodeLocation *)_Var4._M_p;
      paVar17 = local_1a8;
      if (local_1a0 != 0) {
        ptVar20 = (type_info *)(local_1a8->_M_local_buf + local_1a0);
        do {
          paVar22 = local_1a8;
          iVar8 = isspace((uint)(byte)ptVar20[-1]);
          paVar17 = paVar22;
          if (iVar8 == 0) break;
          paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(ptVar20 + -1);
          uVar28 = (long)paVar25 - (long)paVar22;
          std::__cxx11::string::_M_erase((ulong)&local_1a8,uVar28);
          ptVar20 = (type_info *)(local_1a8->_M_local_buf + uVar28);
          paVar17 = local_1a8;
        } while (paVar25 != paVar22);
      }
      local_1a8 = &local_198;
      local_258._M_dataplus._M_p = (pointer)paVar17;
      if (paVar17 == local_1a8) {
        local_258.field_2._8_8_ = local_198._8_8_;
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      }
      _Var4._M_p = local_258._M_dataplus._M_p;
      local_258.field_2._M_allocated_capacity._1_7_ = local_198._M_allocated_capacity._1_7_;
      local_258.field_2._M_local_buf[0] = local_198._M_local_buf[0];
      local_258._M_string_length = local_1a0;
      local_1a0 = 0;
      local_198._M_local_buf[0] = '\0';
      GetTypeName_abi_cxx11_
                (&local_208,(internal *)&unsigned_long::typeinfo,
                 (type_info *)local_1a8->_M_local_buf);
      _Var5._M_p = local_208._M_dataplus._M_p;
      local_238.file._M_dataplus._M_p = (pointer)&local_238.file.field_2;
      pcVar2 = (pCVar11->file)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,pcVar2,pcVar2 + (pCVar11->file)._M_string_length);
      local_238.line = pCVar11->line;
      p_Var13 = SuiteApiResolver<gtest_suite_UnsignedToString_::Max<unsigned_long>_>::
                GetSetUpCaseOrSuite((pCVar11->file)._M_dataplus._M_p,local_238.line);
      p_Var14 = SuiteApiResolver<gtest_suite_UnsignedToString_::Max<unsigned_long>_>::
                GetTearDownCaseOrSuite((pCVar11->file)._M_dataplus._M_p,pCVar11->line);
      pTVar15 = (TestFactoryBase *)operator_new(8);
      pTVar15->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0023f1a0;
      MakeAndRegisterTestInfo
                ((char *)local_210,_Var4._M_p,_Var5._M_p,(char *)0x0,&local_238,
                 &TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_long>>::dummy_,
                 p_Var13,p_Var14,pTVar15);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238.file._M_dataplus._M_p != &local_238.file.field_2) {
        operator_delete(local_238.file._M_dataplus._M_p,
                        local_238.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,
                        CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0.file._M_dataplus._M_p != &local_2a0.file.field_2) {
        operator_delete(local_2a0.file._M_dataplus._M_p,
                        local_2a0.file.field_2._M_allocated_capacity + 1);
      }
      if (local_300 != &local_2f0) {
        operator_delete(local_300,local_2f0 + 1);
      }
      if (local_2c0 != &local_2b0) {
        operator_delete(local_2c0,local_2b0 + 1);
      }
      if (local_2e0 != (type_info *)&local_2d0) {
        operator_delete(local_2e0,local_2d0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      local_258.field_2._M_allocated_capacity._0_4_ = 0x533255;
      local_258._M_string_length = 3;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_258);
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 == paVar17) {
        local_278.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
        local_278.field_2._8_8_ = plVar12[3];
      }
      else {
        local_278.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
        local_278._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_278._M_string_length = plVar12[1];
      *plVar12 = (long)paVar17;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_278);
      local_2e0 = (type_info *)&local_2d0;
      ptVar20 = (type_info *)(plVar12 + 2);
      if ((type_info *)*plVar12 == ptVar20) {
        local_2d0 = *(long *)ptVar20;
        lStack_2c8 = plVar12[3];
      }
      else {
        local_2d0 = *(long *)ptVar20;
        local_2e0 = (type_info *)*plVar12;
      }
      local_2d8 = plVar12[1];
      *plVar12 = (long)ptVar20;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_2e0);
      local_2c0 = &local_2b0;
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_2b0 = *plVar18;
        lStack_2a8 = plVar12[3];
      }
      else {
        local_2b0 = *plVar18;
        local_2c0 = (long *)*plVar12;
      }
      local_2b8 = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_2c0,*(ulong *)(*(long *)local_168 + 0x60));
      local_300 = &local_2f0;
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_2f0 = *plVar18;
        lStack_2e8 = plVar12[3];
      }
      else {
        local_2f0 = *plVar18;
        local_300 = (long *)*plVar12;
      }
      plVar3 = local_300;
      local_2f8 = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      pcVar16 = strchr(pcVar9,0x2c);
      if (pcVar16 == (char *)0x0) {
        std::__cxx11::string::string((string *)&local_188,pcVar9,&local_129);
      }
      else {
        local_188 = &local_178;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,pcVar9,pcVar16);
      }
      paVar17 = local_188;
      if (local_180 != 0) {
        ptVar20 = (type_info *)(local_188->_M_local_buf + local_180);
        do {
          paVar22 = local_188;
          iVar8 = isspace((uint)(byte)ptVar20[-1]);
          paVar17 = paVar22;
          if (iVar8 == 0) break;
          paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(ptVar20 + -1);
          uVar28 = (long)paVar25 - (long)paVar22;
          std::__cxx11::string::_M_erase((ulong)&local_188,uVar28);
          ptVar20 = (type_info *)(local_188->_M_local_buf + uVar28);
          paVar17 = local_188;
        } while (paVar25 != paVar22);
      }
      local_188 = &local_178;
      local_208._M_dataplus._M_p = (pointer)paVar17;
      if (paVar17 == local_188) {
        local_208.field_2._8_8_ = local_178._8_8_;
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      }
      _Var4._M_p = local_208._M_dataplus._M_p;
      local_208.field_2._M_allocated_capacity._1_7_ = local_178._M_allocated_capacity._1_7_;
      local_208.field_2._M_local_buf[0] = local_178._M_local_buf[0];
      local_208._M_string_length = local_180;
      local_180 = 0;
      local_178._M_local_buf[0] = '\0';
      GetTypeName_abi_cxx11_
                (&local_b8,(internal *)&unsigned_long_long::typeinfo,
                 (type_info *)local_188->_M_local_buf);
      _Var5._M_p = local_b8._M_dataplus._M_p;
      local_2a0.file._M_dataplus._M_p = (pointer)&local_2a0.file.field_2;
      pcVar2 = (pCVar11->file)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2a0,pcVar2,pcVar2 + (pCVar11->file)._M_string_length);
      local_2a0.line = pCVar11->line;
      p_Var13 = SuiteApiResolver<gtest_suite_UnsignedToString_::Max<unsigned_long_long>_>::
                GetSetUpCaseOrSuite((pCVar11->file)._M_dataplus._M_p,local_2a0.line);
      p_Var14 = SuiteApiResolver<gtest_suite_UnsignedToString_::Max<unsigned_long_long>_>::
                GetTearDownCaseOrSuite((pCVar11->file)._M_dataplus._M_p,pCVar11->line);
      pTVar15 = (TestFactoryBase *)operator_new(8);
      pTVar15->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_0023f238;
      MakeAndRegisterTestInfo
                ((char *)plVar3,_Var4._M_p,_Var5._M_p,(char *)0x0,&local_2a0,
                 &TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_long_long>>::dummy_,
                 p_Var13,p_Var14,pTVar15);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0.file._M_dataplus._M_p != &local_2a0.file.field_2) {
        operator_delete(local_2a0.file._M_dataplus._M_p,
                        local_2a0.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if (local_188 != &local_178) {
        operator_delete(local_188,
                        CONCAT71(local_178._M_allocated_capacity._1_7_,local_178._M_local_buf[0]) +
                        1);
      }
      if (local_300 != &local_2f0) {
        operator_delete(local_300,local_2f0 + 1);
      }
      if (local_2c0 != &local_2b0) {
        operator_delete(local_2c0,local_2b0 + 1);
      }
      if (local_2e0 != (type_info *)&local_2d0) {
        operator_delete(local_2e0,local_2d0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)test_name_1._M_dataplus._M_p != &test_name_1.field_2) {
        operator_delete(test_name_1._M_dataplus._M_p,test_name_1.field_2._M_allocated_capacity + 1);
      }
      if (local_58[0] != (internal *)local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      paVar17 = &test_name.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)test_name._M_dataplus._M_p != paVar17) {
        operator_delete(test_name._M_dataplus._M_p,test_name.field_2._M_allocated_capacity + 1);
        paVar17 = extraout_RAX;
      }
      return SUB81(paVar17,0);
    }
  }
  FormatFileLocation_abi_cxx11_(&local_2a0.file,local_58[0],(char *)(ulong)local_38,iVar8);
  TypeParameterizedTestSuite<(anonymous_namespace)::UnsignedToString,testing::internal::Templates<gtest_suite_UnsignedToString_::Ten,gtest_suite_UnsignedToString_::Max>,testing::internal::Types<unsigned_char,unsigned_int,unsigned_long,unsigned_long_long>>
  ::Register();
  if (local_300 != &local_2f0) {
    operator_delete(local_300,local_2f0 + 1);
  }
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0,local_2b0 + 1);
  }
  if (local_2e0 != (type_info *)&local_2d0) {
    operator_delete(local_2e0,local_2d0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test_name_1._M_dataplus._M_p != &test_name_1.field_2) {
    operator_delete(test_name_1._M_dataplus._M_p,test_name_1.field_2._M_allocated_capacity + 1);
  }
  if (local_58[0] != (internal *)local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test_name._M_dataplus._M_p != &test_name.field_2) {
    operator_delete(test_name._M_dataplus._M_p,test_name.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX_00);
}

Assistant:

static bool Register(const char* prefix, CodeLocation code_location,
                       const TypedTestSuitePState* state, const char* case_name,
                       const char* test_names,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    RegisterTypeParameterizedTestSuiteInstantiation(case_name);
    std::string test_name = StripTrailingSpaces(
        GetPrefixUntilComma(test_names));
    if (!state->TestExists(test_name)) {
      fprintf(stderr, "Failed to get code location for test %s.%s at %s.",
              case_name, test_name.c_str(),
              FormatFileLocation(code_location.file.c_str(),
                                 code_location.line).c_str());
      fflush(stderr);
      posix::Abort();
    }
    const CodeLocation& test_location = state->GetCodeLocation(test_name);

    typedef typename Tests::Head Head;

    // First, register the first test in 'Test' for each type in 'Types'.
    TypeParameterizedTest<Fixture, Head, Types>::Register(
        prefix, test_location, case_name, test_names, 0, type_names);

    // Next, recurses (at compile time) with the tail of the test list.
    return TypeParameterizedTestSuite<Fixture, typename Tests::Tail,
                                      Types>::Register(prefix, code_location,
                                                       state, case_name,
                                                       SkipComma(test_names),
                                                       type_names);
  }